

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall
LLVMBC::ModuleParseContext::parse_function_body(ModuleParseContext *this,BlockOrRecord *entry)

{
  Function *this_00;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  iterator __first;
  iterator __last;
  LoggingCallback p_Var4;
  void *pvVar5;
  reference ppFVar6;
  Argument *arg_00;
  vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_> *this_01;
  initializer_list<LLVMBC::BasicBlock_*> local_10c8;
  vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_> local_10b8;
  BlockOrRecord *local_10a0;
  BlockOrRecord *child;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<BlockOrRecord> *__range1;
  Argument *arg;
  Type *param_type;
  FunctionType *pFStack_1068;
  uint i;
  FunctionType *func_type;
  char local_1058 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  undefined1 local_38 [8];
  Vector<Value_*> global_values;
  BlockOrRecord *entry_local;
  ModuleParseContext *this_local;
  
  global_values.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)entry;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            ((vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)local_38,
             &this->values);
  if ((this->seen_first_function_body & 1U) == 0) {
    __first = std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>::
              begin(&this->functions_with_bodies);
    __last = std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>::
             end(&this->functions_with_bodies);
    std::
    reverse<__gnu_cxx::__normal_iterator<LLVMBC::Function**,std::vector<LLVMBC::Function*,dxil_spv::ThreadLocalAllocator<LLVMBC::Function*>>>>
              ((__normal_iterator<LLVMBC::Function_**,_std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>_>
                )__first._M_current,
               (__normal_iterator<LLVMBC::Function_**,_std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>_>
                )__last._M_current);
    this->seen_first_function_body = true;
  }
  bVar2 = std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>::
          empty(&this->functions_with_bodies);
  if (bVar2) {
    p_Var4 = dxil_spv::get_thread_log_callback();
    if (p_Var4 == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: No more functions to process?\n");
      fflush(_stderr);
    }
    else {
      snprintf(local_1058,0x1000,"No more functions to process?\n");
      pvVar5 = dxil_spv::get_thread_log_callback_userdata();
      (*p_Var4)(pvVar5,Error,local_1058);
    }
    this_local._7_1_ = false;
  }
  else {
    ppFVar6 = std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>::
              back(&this->functions_with_bodies);
    this->function = *ppFVar6;
    std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>::pop_back
              (&this->functions_with_bodies);
    pFStack_1068 = Function::getFunctionType(this->function);
    for (param_type._4_4_ = 0; uVar1 = param_type._4_4_,
        uVar3 = FunctionType::getNumParams(pFStack_1068), uVar1 < uVar3;
        param_type._4_4_ = param_type._4_4_ + 1) {
      arg = (Argument *)FunctionType::getParamType(pFStack_1068,param_type._4_4_);
      arg_00 = LLVMContext::construct<LLVMBC::Argument,LLVMBC::Type*&,unsigned_int&>
                         (this->context,(Type **)&arg,(uint *)((long)&param_type + 4));
      Function::add_argument(this->function,arg_00);
      add_value(this,&arg_00->super_Value);
    }
    this_01 = (vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
               *)(global_values.
                  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    __end1 = std::
             vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>::
             begin(this_01);
    child = (BlockOrRecord *)
            std::
            vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>::
            end(this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
                                       *)&child), bVar2) {
      local_10a0 = __gnu_cxx::
                   __normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
                   ::operator*(&__end1);
      bVar2 = BlockOrRecord::IsBlock(local_10a0);
      if (bVar2) {
        bVar2 = parse_function_child_block(this,local_10a0);
        if (!bVar2) {
          this_local._7_1_ = false;
          goto LAB_0023afa0;
        }
      }
      else {
        bVar2 = parse_record(this,local_10a0);
        if (!bVar2) {
          this_local._7_1_ = false;
          goto LAB_0023afa0;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
      ::operator++(&__end1);
    }
    bVar2 = resolve_forward_references(this);
    if (bVar2) {
      bVar2 = resolve_global_initializations(this);
      if (bVar2) {
        this_00 = this->function;
        std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
        vector(&local_10b8,&this->basic_blocks);
        Function::set_basic_blocks(this_00,&local_10b8);
        std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
        ~vector(&local_10b8);
        std::initializer_list<LLVMBC::BasicBlock_*>::initializer_list(&local_10c8);
        std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
        operator=(&this->basic_blocks,local_10c8);
        this->basic_block_index = 0;
        Module::add_function_implementation(this->module,this->function);
        std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::operator=
                  (&this->values,
                   (vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)
                   local_38);
        std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>::
        clear(&this->instructions);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
LAB_0023afa0:
  func_type._4_4_ = 1;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::~vector
            ((vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)local_38);
  return this_local._7_1_;
}

Assistant:

bool ModuleParseContext::parse_function_body(const BlockOrRecord &entry)
{
	auto global_values = values;

	// I think we are supposed to process functions in same order as the module declared them?
	if (!seen_first_function_body)
	{
		std::reverse(functions_with_bodies.begin(), functions_with_bodies.end());
		seen_first_function_body = true;
	}

	if (functions_with_bodies.empty())
	{
		LOGE("No more functions to process?\n");
		return false;
	}

	function = functions_with_bodies.back();
	functions_with_bodies.pop_back();

	auto *func_type = function->getFunctionType();
	for (unsigned i = 0; i < func_type->getNumParams(); i++)
	{
		auto *param_type = func_type->getParamType(i);
		auto *arg = context->construct<Argument>(param_type, i);
		function->add_argument(arg);
		add_value(arg);
	}

	for (auto &child : entry.children)
	{
		if (child.IsBlock())
		{
			if (!parse_function_child_block(child))
				return false;
		}
		else
		{
			if (!parse_record(child))
				return false;
		}
	}

	if (!resolve_forward_references())
		return false;
	if (!resolve_global_initializations())
		return false;

	function->set_basic_blocks(std::move(basic_blocks));
	basic_blocks = {};
	basic_block_index = 0;
	module->add_function_implementation(function);

	values = global_values;
	instructions.clear();
	return true;
}